

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O2

void __thiscall fs_logger::debug(fs_logger *this,string *log_line)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&this->fs_,(string *)log_line);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void debug(const std::string& log_line)
    {
        fs_ << log_line << std::endl;
        fs_.flush();
    }